

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall Connection::onDataAvailable(Connection *this,SharedPtr *client,Buffer *buf)

{
  bool bVar1;
  uint8_t uVar2;
  uint uVar3;
  size_t sVar4;
  ssize_t sVar5;
  char *pcVar6;
  ulong uVar7;
  element_type *this_00;
  element_type *this_01;
  Signal<std::function<void_(std::shared_ptr<Message>,_std::shared_ptr<Connection>)>_> *this_02;
  element_type *this_03;
  size_t in_RCX;
  Connection *__nbytes;
  int iVar8;
  shared_ptr<Connection> *args;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *args_00;
  SharedPtr *pSVar9;
  Log local_4100;
  Log local_40f0;
  String local_40e0;
  Log local_40c0;
  shared_ptr<FinishMessage> local_40b0;
  undefined1 local_40a0 [8];
  shared_ptr<Connection> that;
  shared_ptr<Message> message;
  MessageError error;
  undefined1 local_4040 [4];
  int read;
  StackBuffer<16384UL,_char> buffer;
  int local_28;
  int read_1;
  uchar b [4];
  uint available;
  Buffer *buf_local;
  SharedPtr *client_local;
  Connection *this_local;
  
  _b = buf;
  while( true ) {
    bVar1 = Buffer::isEmpty(_b);
    if (!bVar1) {
      Buffers::push(&this->mBuffers,_b);
    }
    sVar4 = Buffers::size(&this->mBuffers);
    read_1 = (int)sVar4;
    if (read_1 == 0) {
      return;
    }
    if (this->mPendingRead == 0) {
      if ((uint)read_1 < 4) {
        return;
      }
      sVar5 = Buffers::read(&this->mBuffers,(int)&local_28,(void *)0x4,in_RCX);
      buffer.mSize._4_4_ = (int)sVar5;
      if (buffer.mSize._4_4_ != 4) {
        __assert_fail("read == 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                      ,0x83,
                      "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)"
                     );
      }
      this->mPendingRead = local_28;
      if (this->mPendingRead < 1) {
        __assert_fail("mPendingRead > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                      ,0x85,
                      "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)"
                     );
      }
      read_1 = read_1 + -4;
      buffer.mSize._4_4_ = 4;
    }
    if (this->mPendingRead < 0) {
      __assert_fail("mPendingRead >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                    ,0x88,
                    "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)");
    }
    if ((uint)read_1 < (uint)this->mPendingRead) break;
    __nbytes = this;
    StackBuffer<16384UL,_char>::StackBuffer
              ((StackBuffer<16384UL,_char> *)local_4040,(long)this->mPendingRead);
    pcVar6 = StackBuffer<16384UL,_char>::buffer((StackBuffer<16384UL,_char> *)local_4040);
    uVar7 = Buffers::read(&this->mBuffers,(int)pcVar6,(void *)(long)this->mPendingRead,
                          (size_t)__nbytes);
    if ((int)uVar7 != this->mPendingRead) {
      __assert_fail("read == mPendingRead",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Gei0r[P]rct/rct/Connection.cpp"
                    ,0x8e,
                    "void Connection::onDataAvailable(const SocketClient::SharedPtr &, Buffer &&)");
    }
    this->mPendingRead = 0;
    Message::MessageError::MessageError
              ((MessageError *)
               &message.super___shared_ptr<Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    iVar8 = this->mVersion;
    pcVar6 = StackBuffer::operator_cast_to_char_((StackBuffer *)local_4040);
    in_RCX = uVar7 & 0xffffffff;
    Message::create((Message *)
                    &that.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                    iVar8,pcVar6,(int)uVar7,
                    (MessageError *)
                    &message.super___shared_ptr<Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &that.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    if (bVar1) {
      std::enable_shared_from_this<Connection>::shared_from_this
                ((enable_shared_from_this<Connection> *)local_40a0);
      this_00 = std::__shared_ptr_access<Message,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Message,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )&that.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
      uVar2 = Message::messageId(this_00);
      if (uVar2 == '\x02') {
        std::static_pointer_cast<FinishMessage,Message>((shared_ptr<Message> *)&local_40b0);
        this_01 = std::__shared_ptr_access<FinishMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<FinishMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&local_40b0);
        uVar3 = FinishMessage::status(this_01);
        in_RCX = (size_t)uVar3;
        this->mFinishStatus = uVar3;
        std::shared_ptr<FinishMessage>::~shared_ptr(&local_40b0);
        args = (shared_ptr<Connection> *)local_40a0;
        Signal<std::function<void(std::shared_ptr<Connection>,int)>>::operator()
                  (&this->mFinished,args,&this->mFinishStatus);
        iVar8 = (int)args;
      }
      else {
        this_02 = newMessage(this);
        args_00 = &that.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        Signal<std::function<void(std::shared_ptr<Message>,std::shared_ptr<Connection>)>>::
        operator()(this_02,(shared_ptr<Message> *)args_00,(shared_ptr<Connection> *)local_40a0);
        iVar8 = (int)args_00;
      }
      std::shared_ptr<Connection>::~shared_ptr((shared_ptr<Connection> *)local_40a0);
    }
    else {
      bVar1 = std::function::operator_cast_to_bool((function *)&this->mErrorHandler);
      if (bVar1) {
        pSVar9 = client;
        std::function<void_(const_std::shared_ptr<SocketClient>_&,_Message::MessageError_&&)>::
        operator()(&this->mErrorHandler,client,
                   (MessageError *)
                   &message.super___shared_ptr<Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        iVar8 = (int)pSVar9;
      }
      else {
        ::error();
        Log::operator<<(&local_40f0,(char *)&local_4100);
        Log::operator<<((Log *)&local_40e0,(int32_t)&local_40f0);
        ::operator<<((Log *)&local_40e0.mString.field_2,&local_40e0);
        iVar8 = (int)&local_40e0 + 0x10;
        Log::operator<<(&local_40c0,iVar8);
        Log::~Log(&local_40c0);
        Log::~Log((Log *)&local_40e0.mString.field_2);
        Log::~Log((Log *)&local_40e0);
        Log::~Log(&local_40f0);
        Log::~Log(&local_4100);
      }
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &that.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
    if (!bVar1) {
      this_03 = std::__shared_ptr_access<SocketClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<SocketClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)client);
      SocketClient::close(this_03,iVar8);
    }
    std::shared_ptr<Message>::~shared_ptr
              ((shared_ptr<Message> *)
               &that.super___shared_ptr<Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    Message::MessageError::~MessageError
              ((MessageError *)
               &message.super___shared_ptr<Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    StackBuffer<16384UL,_char>::~StackBuffer((StackBuffer<16384UL,_char> *)local_4040);
  }
  return;
}

Assistant:

void Connection::onDataAvailable(const SocketClient::SharedPtr &client, Buffer&& buf)
{
    while (true) {
        if (!buf.isEmpty())
            mBuffers.push(std::forward<Buffer>(buf));

        unsigned int available = mBuffers.size();
        if (!available)
            break;
        if (!mPendingRead) {
            if (available < static_cast<int>(sizeof(uint32_t)))
                break;
            union {
                unsigned char b[sizeof(uint32_t)];
                int pending;
            };
            const int read = mBuffers.read(b, 4);
            assert(read == 4);
            mPendingRead = pending;
            assert(mPendingRead > 0);
            available -= read;
        }
        assert(mPendingRead >= 0);
        if (available < static_cast<unsigned int>(mPendingRead))
            break;

        StackBuffer<1024 * 16> buffer(mPendingRead);
        const int read = mBuffers.read(buffer.buffer(), mPendingRead);
        assert(read == mPendingRead);
        mPendingRead = 0;
        Message::MessageError error;
        std::shared_ptr<Message> message = Message::create(mVersion, buffer, read, &error);
        if (message) {
            auto that = shared_from_this();
            if (message->messageId() == FinishMessage::MessageId) {
                mFinishStatus = std::static_pointer_cast<FinishMessage>(message)->status();
                mFinished(that, mFinishStatus);
            } else {
                newMessage()(message, that);
            }
        } else if (mErrorHandler) {
            mErrorHandler(client, std::move(error));
        } else {
            ::error() << "Unable to create message from data" << error.type << error.text << read;
        }
        if (!message)
            client->close();
    }
}